

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

ParseStatus
re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  bool bVar1;
  ParseFlags PVar2;
  int iVar3;
  size_type sVar4;
  const_reference pcVar5;
  const_pointer pcVar6;
  const_pointer pcVar7;
  const_pointer pcVar8;
  UGroup *g_00;
  UGroup *g;
  const_pointer local_90;
  StringPiece local_88;
  size_type local_78;
  size_t end;
  const_pointer local_68;
  char *local_60;
  char *p;
  StringPiece name;
  StringPiece seq;
  int sign;
  Rune c;
  RegexpStatus *status_local;
  CharClassBuilder *cc_local;
  ParseFlags parse_flags_local;
  StringPiece *s_local;
  
  PVar2 = operator&(parse_flags,UnicodeGroups);
  if (PVar2 == NoParseFlags) {
    s_local._4_4_ = kParseNothing;
  }
  else {
    sVar4 = StringPiece::size(s);
    if ((sVar4 < 2) || (pcVar5 = StringPiece::operator[](s,0), *pcVar5 != '\\')) {
      s_local._4_4_ = kParseNothing;
    }
    else {
      pcVar5 = StringPiece::operator[](s,1);
      seq.size_._4_4_ = (int)*pcVar5;
      if ((seq.size_._4_4_ == 0x70) || (seq.size_._4_4_ == 0x50)) {
        seq.size_._0_4_ = 1;
        if (seq.size_._4_4_ == 0x50) {
          seq.size_._0_4_ = -1;
        }
        name.size_ = (size_type)s->data_;
        seq.data_ = (const_pointer)s->size_;
        StringPiece::StringPiece((StringPiece *)&p);
        StringPiece::remove_prefix(s,2);
        iVar3 = StringPieceToRune((Rune *)((long)&seq.size_ + 4),s,status);
        if (iVar3 == 0) {
          s_local._4_4_ = kParseError;
        }
        else {
          if (seq.size_._4_4_ == 0x7b) {
            local_78 = StringPiece::find(s,'}',0);
            if (local_78 == 0xffffffffffffffff) {
              bVar1 = IsValidUTF8((StringPiece *)&name.size_,status);
              if (!bVar1) {
                return kParseError;
              }
              RegexpStatus::set_code(status,kRegexpBadCharRange);
              RegexpStatus::set_error_arg(status,(StringPiece *)&name.size_);
              return kParseError;
            }
            pcVar6 = StringPiece::data(s);
            StringPiece::StringPiece(&local_88,pcVar6,local_78);
            p = local_88.data_;
            name.data_ = (const_pointer)local_88.size_;
            StringPiece::remove_prefix(s,local_78 + 1);
            bVar1 = IsValidUTF8((StringPiece *)&p,status);
            if (!bVar1) {
              return kParseError;
            }
          }
          else {
            pcVar6 = StringPiece::data((StringPiece *)&name.size_);
            local_60 = pcVar6 + 2;
            pcVar7 = StringPiece::data(s);
            StringPiece::StringPiece((StringPiece *)&end,pcVar6 + 2,(long)pcVar7 - (long)local_60);
            p = (char *)end;
            name.data_ = local_68;
          }
          pcVar6 = StringPiece::data((StringPiece *)&name.size_);
          pcVar7 = StringPiece::data(s);
          pcVar8 = StringPiece::data((StringPiece *)&name.size_);
          StringPiece::StringPiece((StringPiece *)&g,pcVar6,(long)pcVar7 - (long)pcVar8);
          name.size_ = (size_type)g;
          seq.data_ = local_90;
          bVar1 = StringPiece::empty((StringPiece *)&p);
          if ((!bVar1) && (pcVar5 = StringPiece::operator[]((StringPiece *)&p,0), *pcVar5 == '^')) {
            seq.size_._0_4_ = -(int)seq.size_;
            StringPiece::remove_prefix((StringPiece *)&p,1);
          }
          g_00 = LookupUnicodeGroup((StringPiece *)&p);
          if (g_00 == (UGroup *)0x0) {
            RegexpStatus::set_code(status,kRegexpBadCharRange);
            RegexpStatus::set_error_arg(status,(StringPiece *)&name.size_);
            s_local._4_4_ = kParseError;
          }
          else {
            AddUGroup(cc,g_00,(int)seq.size_,parse_flags);
            s_local._4_4_ = kParseOk;
          }
        }
      }
      else {
        s_local._4_4_ = kParseNothing;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.data() + 2;
    name = StringPiece(p, static_cast<size_t>(s->data() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == StringPiece::npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->data(), end);  // without '}'
    s->remove_prefix(end + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.data(), static_cast<size_t>(s->data() - seq.data()));

  if (!name.empty() && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      std::string("\\p{") + std::string(name) + std::string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  PODArray<URange32> r(nr);
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r.data(), nr};
  AddUGroup(cc, &g, sign, parse_flags);
#endif

  return kParseOk;
}